

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_ord(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char cVar1;
  undefined8 in_RAX;
  char *pcVar2;
  jx9_value *pObj;
  int nLen;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  if (0 < nArg) {
    pcVar2 = jx9_value_to_string(*apArg,&local_14);
    if (0 < local_14) {
      cVar1 = *pcVar2;
      pObj = pCtx->pRet;
      jx9MemObjRelease(pObj);
      pObj->x = (anon_union_8_3_18420de5_for_x)(long)cVar1;
      goto LAB_001317d9;
    }
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).iVal = -1;
LAB_001317d9:
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_ord(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString;
	int nLen, c;
	if( nArg < 1 ){
		/* Missing arguments, return -1 */
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return -1 */
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Extract the ASCII value of the first character */
	c = zString[0];
	/* Return that value */
	jx9_result_int(pCtx, c);
	return JX9_OK;
}